

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O0

void __thiscall
Eigen::
SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
::solveInPlace<Eigen::Matrix<double,_1,3,0,_1,3>>
          (SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *X)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  Index IVar7;
  Index *pIVar8;
  Scalar_conflict *pSVar9;
  Scalar *pSVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  int __c;
  MappedSparseMatrix<double,_0,_int> *mat;
  Scalar SVar14;
  undefined1 local_120 [4];
  Index irow;
  InnerIterator it;
  Index jcol;
  Index j_1;
  triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_2U>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  local_d8;
  OuterStride<_1> local_a8;
  undefined1 local_98 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> U;
  undefined1 local_60 [8];
  Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  Index j;
  Index luptr;
  Index nsupc;
  Index lda;
  Index fsupc;
  Index k;
  Index n;
  Index nrhs;
  MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *X_local;
  SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,_int>,_Eigen::MappedSparseMatrix<double,_0,_int>_>
  *this_local;
  
  IVar7 = EigenBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::cols
                    ((EigenBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)X);
  iVar6 = (int)IVar7;
  IVar7 = EigenBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                    ((EigenBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)X);
  for (lda = internal::MappedSuperNodalMatrix<double,_int>::nsuper
                       (*(MappedSuperNodalMatrix<double,_int> **)this); -1 < lda; lda = lda + -1) {
    pIVar8 = internal::MappedSuperNodalMatrix<double,_int>::supToCol
                       (*(MappedSuperNodalMatrix<double,_int> **)this);
    iVar2 = pIVar8[lda];
    pIVar8 = internal::MappedSuperNodalMatrix<double,_int>::colIndexPtr
                       (*(MappedSuperNodalMatrix<double,_int> **)this);
    iVar3 = pIVar8[iVar2 + 1];
    pIVar8 = internal::MappedSuperNodalMatrix<double,_int>::colIndexPtr
                       (*(MappedSuperNodalMatrix<double,_int> **)this);
    iVar4 = pIVar8[iVar2];
    pIVar8 = internal::MappedSuperNodalMatrix<double,_int>::supToCol
                       (*(MappedSuperNodalMatrix<double,_int> **)this);
    iVar12 = pIVar8[lda + 1] - iVar2;
    pIVar8 = internal::MappedSuperNodalMatrix<double,_int>::colIndexPtr
                       (*(MappedSuperNodalMatrix<double,_int> **)this);
    A.m_stride.super_Stride<_1,_0>._12_4_ = pIVar8[iVar2];
    if (iVar12 == 1) {
      for (A.m_stride.super_Stride<_1,_0>._8_4_ = 0;
          (int)A.m_stride.super_Stride<_1,_0>._8_4_ < iVar6;
          A.m_stride.super_Stride<_1,_0>._8_4_ = A.m_stride.super_Stride<_1,_0>._8_4_ + 1) {
        pSVar9 = internal::MappedSuperNodalMatrix<double,_int>::valuePtr
                           (*(MappedSuperNodalMatrix<double,_int> **)this);
        dVar1 = pSVar9[(int)A.m_stride.super_Stride<_1,_0>._12_4_];
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,
                             (long)iVar2,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
        *pSVar10 = *pSVar10 / dVar1;
      }
    }
    else {
      pSVar9 = internal::MappedSuperNodalMatrix<double,_int>::valuePtr
                         (*(MappedSuperNodalMatrix<double,_int> **)this);
      lVar13 = (long)(int)A.m_stride.super_Stride<_1,_0>._12_4_;
      OuterStride<-1>::OuterStride
                ((OuterStride<_1> *)&U.m_stride.super_Stride<_1,_0>.field_0x8,(long)(iVar3 - iVar4))
      ;
      Map<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
                ((Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_60,pSVar9 + lVar13,(long)iVar12,(long)iVar12,
                 (OuterStride<_1> *)&U.m_stride.super_Stride<_1,_0>.field_0x8);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,
                           (long)iVar2,0);
      OuterStride<-1>::OuterStride(&local_a8,(long)(int)IVar7);
      Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
                ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_98,pSVar10,(long)iVar12,(long)iVar6,&local_a8);
      MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>>::
      triangularView<2u>((Type *)&jcol,
                         (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>>
                          *)local_60);
      TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,2u>
      ::solve<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                (&local_d8,
                 (TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>,2u>
                  *)&jcol,(MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           *)local_98);
      MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
      operator=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                 *)local_98,
                (ReturnByValue<Eigen::internal::triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_2U>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>_>
                 *)&local_d8);
    }
    for (it.m_end = 0; iVar3 = iVar2, it.m_end < iVar6; it.m_end = it.m_end + 1) {
      while (it.m_start = iVar3, it.m_start < iVar2 + iVar12) {
        mat = *(MappedSparseMatrix<double,_0,_int> **)(this + 8);
        MappedSparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
                  ((InnerIterator *)local_120,mat,it.m_start);
        while (bVar5 = MappedSparseMatrix::InnerIterator::operator_cast_to_bool
                                 ((InnerIterator *)local_120), bVar5) {
          pcVar11 = MappedSparseMatrix<double,_0,_int>::InnerIterator::index
                              ((InnerIterator *)local_120,(char *)mat,__c);
          pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,
                               (long)it.m_start,(long)it.m_end);
          dVar1 = *pSVar10;
          SVar14 = MappedSparseMatrix<double,_0,_int>::InnerIterator::value
                             ((InnerIterator *)local_120);
          mat = (MappedSparseMatrix<double,_0,_int> *)(long)(int)pcVar11;
          pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,
                               (Index)mat,(long)it.m_end);
          *pSVar10 = -dVar1 * SVar14 + *pSVar10;
          MappedSparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)local_120);
        }
        iVar3 = it.m_start + 1;
      }
    }
  }
  return;
}

Assistant:

void solveInPlace(MatrixBase<Dest> &X) const
  {
    Index nrhs = X.cols();
    Index n = X.rows();
    // Backward solve with U
    for (Index k = m_mapL.nsuper(); k >= 0; k--)
    {
      Index fsupc = m_mapL.supToCol()[k];
      Index lda = m_mapL.colIndexPtr()[fsupc+1] - m_mapL.colIndexPtr()[fsupc]; // leading dimension
      Index nsupc = m_mapL.supToCol()[k+1] - fsupc;
      Index luptr = m_mapL.colIndexPtr()[fsupc];

      if (nsupc == 1)
      {
        for (Index j = 0; j < nrhs; j++)
        {
          X(fsupc, j) /= m_mapL.valuePtr()[luptr];
        }
      }
      else
      {
        Map<const Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A( &(m_mapL.valuePtr()[luptr]), nsupc, nsupc, OuterStride<>(lda) );
        Map< Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > U (&(X(fsupc,0)), nsupc, nrhs, OuterStride<>(n) );
        U = A.template triangularView<Upper>().solve(U);
      }

      for (Index j = 0; j < nrhs; ++j)
      {
        for (Index jcol = fsupc; jcol < fsupc + nsupc; jcol++)
        {
          typename MatrixUType::InnerIterator it(m_mapU, jcol);
          for ( ; it; ++it)
          {
            Index irow = it.index();
            X(irow, j) -= X(jcol, j) * it.value();
          }
        }
      }
    } // End For U-solve
  }